

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O3

bool Js::JavascriptExceptionOperators::IsErrorInstance(Var thrownObject)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  JavascriptError *pJVar5;
  RecyclableObject *instance;
  undefined4 *puVar6;
  
  if (thrownObject != (Var)0x0) {
    bVar3 = VarIs<Js::JavascriptError>(thrownObject);
    if (bVar3) {
      pJVar5 = VarTo<Js::JavascriptError>(thrownObject);
      return pJVar5->isPrototype == 0;
    }
    if ((ulong)thrownObject >> 0x30 == 0) {
      instance = VarTo<Js::RecyclableObject>(thrownObject);
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      do {
        instance = JavascriptOperators::GetPrototype(instance);
        if (instance == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                             ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar3) goto LAB_00a96e3c;
          *puVar6 = 0;
        }
        TVar1 = ((instance->type).ptr)->typeId;
        if ((int)TVar1 < 0x58) {
          if (TVar1 == TypeIds_Null) {
            return false;
          }
        }
        else {
          BVar4 = RecyclableObject::IsExternal(instance);
          if (BVar4 == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar6 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                               ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                               "GetTypeId aValue has invalid TypeId");
            if (!bVar3) {
LAB_00a96e3c:
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *puVar6 = 0;
          }
        }
        bVar3 = VarIs<Js::JavascriptError,Js::RecyclableObject>(instance);
        if (bVar3) {
          return true;
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

bool JavascriptExceptionOperators::IsErrorInstance(Var thrownObject)
    {
        if (thrownObject && VarIs<JavascriptError>(thrownObject))
        {
            return !VarTo<JavascriptError>(thrownObject)->IsPrototype();
        }

        if (thrownObject && VarIs<RecyclableObject>(thrownObject))
        {
            RecyclableObject* obj = VarTo<RecyclableObject>(thrownObject);

            while (true)
            {
                obj = JavascriptOperators::GetPrototype(obj);
                if (JavascriptOperators::GetTypeId(obj) == TypeIds_Null)
                {
                    break;
                }

                if (VarIs<JavascriptError>(obj))
                {
                    return true;
                }
            }
        }

        return false;
    }